

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O1

void __thiscall cursespp::AppLayout::EnableDemoModeIfNecessary(AppLayout *this)

{
  return;
}

Assistant:

void AppLayout::EnableDemoModeIfNecessary() {
#if ENABLE_DEMO_MODE
    App::Instance().SetKeyHook([this](const std::string& key) -> bool {
        static std::map<std::string, std::string> SANITIZE = {
            { "^I", "TAB" }, { " ", "SPACE" }, { "^[", "ESC" }
        };

        auto it = SANITIZE.find(key);
        std::string normalized = (it == SANITIZE.end()) ? key : it->second;

        if (normalized == lastKey) {
            ++lastKeyRepeat;
            if (lastKeyRepeat >= 2) {
                normalized = normalized + " (x" + std::to_string(lastKeyRepeat) + ")";
            }
        }
        else {
            lastKey = normalized;
            lastKeyRepeat = 1;
        }

        std::string keypress = "keypress: " + (normalized.size() ? normalized : "<none>");
        this->hotkey->SetText(keypress, text::AlignCenter);
        return false;
    });
#endif
}